

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O1

Module * __thiscall
LLVMBC::LLVMContext::construct<LLVMBC::Module,LLVMBC::LLVMContext&>
          (LLVMContext *this,LLVMContext *u)

{
  Module *ptr;
  
  ptr = (Module *)allocate(this,0xc0,8);
  if (ptr != (Module *)0x0) {
    ptr->context = u;
    (ptr->functions).
    super__Vector_base<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (ptr->functions).
    super__Vector_base<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (ptr->functions).
    super__Vector_base<LLVMBC::Function_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Function_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (ptr->globals).
    super__Vector_base<LLVMBC::GlobalVariable_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::GlobalVariable_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (ptr->globals).
    super__Vector_base<LLVMBC::GlobalVariable_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::GlobalVariable_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (ptr->globals).
    super__Vector_base<LLVMBC::GlobalVariable_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::GlobalVariable_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (ptr->value_symtab)._M_h._M_buckets = &(ptr->value_symtab)._M_h._M_single_bucket;
    (ptr->value_symtab)._M_h._M_bucket_count = 1;
    (ptr->value_symtab)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (ptr->value_symtab)._M_h._M_element_count = 0;
    (ptr->value_symtab)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (ptr->value_symtab)._M_h._M_rehash_policy._M_next_resize = 0;
    (ptr->value_symtab)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (ptr->named_metadata)._M_h._M_buckets = &(ptr->named_metadata)._M_h._M_single_bucket;
    (ptr->named_metadata)._M_h._M_bucket_count = 1;
    (ptr->named_metadata)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (ptr->named_metadata)._M_h._M_element_count = 0;
    (ptr->named_metadata)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (ptr->named_metadata)._M_h._M_rehash_policy._M_next_resize = 0;
    (ptr->named_metadata)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (ptr->unnamed_metadata).
    super__Vector_base<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (ptr->unnamed_metadata).
    super__Vector_base<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (ptr->unnamed_metadata).
    super__Vector_base<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    append_typed_destructor<LLVMBC::Module>(this,ptr);
    return ptr;
  }
  std::terminate();
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}